

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O0

Node * __thiscall
dynet::LookupNode::autobatch_pseudo_node
          (LookupNode *this,ComputationGraph *cg,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *batch_ids)

{
  bool bVar1;
  reference puVar2;
  const_reference ppNVar3;
  Node *pNVar4;
  undefined8 in_RDX;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *in_RSI;
  uint word_id;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  uint batch_id;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  LookupNode *ln;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff68;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  const_iterator in_stack_ffffffffffffff80;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_78;
  Device *in_stack_ffffffffffffff90;
  LookupNode *in_stack_ffffffffffffff98;
  LookupParameter in_stack_ffffffffffffffa0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  undefined8 local_40;
  value_type local_38;
  undefined8 local_18;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xd54439);
  local_38 = (value_type)0x0;
  local_40 = local_18;
  local_48._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (in_stack_ffffffffffffff68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff68);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff70,
                            (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)in_stack_ffffffffffffff68), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_48);
    ppNVar3 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::operator[]
                        (local_10,(ulong)*puVar2);
    local_38 = *ppNVar3;
    if (*(long *)(local_38[1].dim.d + 2) == 0) {
      in_stack_ffffffffffffff90 = local_38[1].device;
      local_78._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             (in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff80 =
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff68);
      while (bVar1 = __gnu_cxx::operator!=
                               (in_stack_ffffffffffffff70,
                                (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)in_stack_ffffffffffffff68), bVar1) {
        puVar2 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_78);
        in_stack_ffffffffffffff7c = *puVar2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   in_stack_ffffffffffffff80._M_current,
                   (value_type_conflict *)
                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&local_78);
      }
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_ffffffffffffff80._M_current,
                 (value_type_conflict *)
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_48);
  }
  pNVar4 = (Node *)operator_new(0xb8);
  LookupNode(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff90);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff80._M_current);
  return pNVar4;
}

Assistant:

Node* LookupNode::autobatch_pseudo_node(const ComputationGraph & cg,
                                        const std::vector<VariableIndex> & batch_ids) const {
  vector<unsigned> ids;
  LookupNode* ln = nullptr;
  for(auto batch_id : batch_ids) {
    ln = static_cast<LookupNode*>(cg.nodes[batch_id]);
    if(ln->pindex != nullptr)
      ids.push_back(*ln->pindex);
    else
      for(auto word_id : *ln->pindices)
        ids.push_back(word_id);
  }
  return new LookupNode(ln->params, ids);
}